

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_UnsafeArenaSwap_Test::TestBody(ArenaTest_UnsafeArenaSwap_Test *this)

{
  TestAllTypes *message;
  TestAllTypes *other;
  TestAllTypes *message2;
  TestAllTypes *message1;
  Arena shared_arena;
  ArenaTest_UnsafeArenaSwap_Test *this_local;
  
  shared_arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message1);
  message = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&message1);
  other = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&message1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  proto2_unittest::TestAllTypes::UnsafeArenaSwap(message,other);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(other);
  Arena::~Arena((Arena *)&message1);
  return;
}

Assistant:

TEST(ArenaTest, UnsafeArenaSwap) {
  Arena shared_arena;
  TestAllTypes* message1 = Arena::Create<TestAllTypes>(&shared_arena);
  TestAllTypes* message2 = Arena::Create<TestAllTypes>(&shared_arena);
  TestUtil::SetAllFields(message1);
  message1->UnsafeArenaSwap(message2);
  TestUtil::ExpectAllFieldsSet(*message2);
}